

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::DockContextCalcDropPosForDocking
               (ImGuiWindow *target,ImGuiDockNode *target_node,ImGuiWindow *payload,
               ImGuiDir split_dir,bool split_outer,ImVec2 *out_pos)

{
  long lVar1;
  undefined7 in_register_00000081;
  ImVec2 IVar2;
  bool bVar3;
  ImGuiDockPreviewData split_data;
  ImGuiDockPreviewData local_150;
  
  if ((int)CONCAT71(in_register_00000081,split_outer) == 0) {
    ImGuiDockPreviewData::ImGuiDockPreviewData(&local_150);
    DockNodePreviewDockSetup(target,target_node,payload,&local_150,false,false);
    lVar1 = (long)split_dir;
    bVar3 = local_150.DropRectsDraw[lVar1 + 1].Min.y <= local_150.DropRectsDraw[lVar1 + 1].Max.y &&
            local_150.DropRectsDraw[lVar1 + 1].Min.x <= local_150.DropRectsDraw[lVar1 + 1].Max.x;
    if (bVar3) {
      IVar2 = ImRect::GetCenter(local_150.DropRectsDraw + lVar1 + 1);
      *out_pos = IVar2;
    }
    ImGuiDockNode::~ImGuiDockNode(&local_150.FutureNode);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::DockContextCalcDropPosForDocking(ImGuiWindow* target, ImGuiDockNode* target_node, ImGuiWindow* payload, ImGuiDir split_dir, bool split_outer, ImVec2* out_pos)
{
    if (split_outer)
    {
        IM_ASSERT(0);
    }
    else
    {
        ImGuiDockPreviewData split_data;
        DockNodePreviewDockSetup(target, target_node, payload, &split_data, false, split_outer);
        if (split_data.DropRectsDraw[split_dir+1].IsInverted())
            return false;
        *out_pos = split_data.DropRectsDraw[split_dir+1].GetCenter();
        return true;
    }
    return false;
}